

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

int __thiscall network::del_object(network *this,iobject *object)

{
  int local_c;
  
  local_c = object->netid_;
  if (local_c != 0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_iobject_*>,_std::_Select1st<std::pair<const_int,_iobject_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iobject_*>_>_>
    ::erase(&(this->objects_)._M_t,&local_c);
    (*object->_vptr_iobject[1])(object);
    return 0;
  }
  __assert_fail("object->get_netid() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/network.cpp"
                ,0x84,"int network::del_object(iobject *)");
}

Assistant:

network::~network()
{

}